

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::UpdateColumn
          (RowGroupCollection *this,TransactionData transaction,Vector *row_ids,
          vector<unsigned_long,_true> *column_path,DataChunk *updates)

{
  idx_t row_number;
  size_type __n;
  const_reference pvVar1;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  reference this_02;
  type this_03;
  BaseStatistics *other;
  ColumnData *this_04;
  NotImplementedException *this_05;
  string local_50;
  
  row_number = *(idx_t *)row_ids->data;
  if ((long)row_number < 0x7ffffffffff080) {
    pvVar1 = vector<unsigned_long,_true>::operator[](column_path,0);
    __n = *pvVar1;
    this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    this_01 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                        (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,row_number);
    RowGroup::UpdateColumn(this_01,transaction,updates,row_ids,column_path);
    TableStatistics::GetLock((TableStatistics *)&local_50);
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
    ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                 *)&local_50);
    this_02 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                        (&(this->stats).column_stats,__n);
    this_03 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_02);
    other = ColumnStatistics::Statistics(this_03);
    this_04 = RowGroup::GetColumn(this_01,__n);
    ColumnData::MergeIntoStatistics(this_04,other);
    ::std::
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>::
    ~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)&local_50);
    return;
  }
  this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Cannot update a column-path on transaction local data","");
  NotImplementedException::NotImplementedException(this_05,&local_50);
  __cxa_throw(this_05,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void RowGroupCollection::Fetch(TransactionData transaction, DataChunk &result, const vector<StorageIndex> &column_ids,
                               const Vector &row_identifiers, idx_t fetch_count, ColumnFetchState &state) {
	// figure out which row_group to fetch from
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);
	idx_t count = 0;
	for (idx_t i = 0; i < fetch_count; i++) {
		auto row_id = row_ids[i];
		RowGroup *row_group;
		{
			idx_t segment_index;
			auto l = row_groups->Lock();
			if (!row_groups->TryGetSegmentIndex(l, UnsafeNumericCast<idx_t>(row_id), segment_index)) {
				// in parallel append scenarios it is possible for the row_id
				continue;
			}
			row_group = row_groups->GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));
		}
		if (!row_group->Fetch(transaction, UnsafeNumericCast<idx_t>(row_id) - row_group->start)) {
			continue;
		}
		row_group->FetchRow(transaction, state, column_ids, row_id, result, count);
		count++;
	}
	result.SetCardinality(count);
}